

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *psVar4;
  string *psVar5;
  void **our_elems;
  int iVar6;
  Arena *pAVar7;
  
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar6 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,
               iVar6,((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->allocated_size
                     - (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar4 = (from->java_package_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->java_package_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->java_package_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = (from->java_outer_classname_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->java_outer_classname_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->java_outer_classname_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 4) != 0) {
      psVar4 = (from->go_package_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->go_package_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->go_package_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 8) != 0) {
      psVar4 = (from->objc_class_prefix_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 8;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->objc_class_prefix_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->objc_class_prefix_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      psVar4 = (from->csharp_namespace_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x10;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->csharp_namespace_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->csharp_namespace_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      psVar4 = (from->swift_prefix_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x20;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->swift_prefix_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->swift_prefix_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 & 0x40) != 0) {
      psVar4 = (from->php_class_prefix_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x40;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->php_class_prefix_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->php_class_prefix_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((char)uVar1 < '\0') {
      psVar4 = (from->php_namespace_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x80;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->php_namespace_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->php_namespace_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      psVar4 = (from->php_metadata_namespace_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x100;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->php_metadata_namespace_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->php_metadata_namespace_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 >> 9 & 1) != 0) {
      psVar4 = (from->ruby_package_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x200;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->ruby_package_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->ruby_package_,pAVar7,psVar4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this->java_multiple_files_ = from->java_multiple_files_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      this->java_generate_equals_and_hash_ = from->java_generate_equals_and_hash_;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this->java_string_check_utf8_ = from->java_string_check_utf8_;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this->cc_generic_services_ = from->cc_generic_services_;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      this->java_generic_services_ = from->java_generic_services_;
    }
    if ((short)uVar1 < 0) {
      this->py_generic_services_ = from->py_generic_services_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  if ((uVar1 & 0xf0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      this->php_generic_services_ = from->php_generic_services_;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      this->deprecated_ = from->deprecated_;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      this->cc_enable_arenas_ = from->cc_enable_arenas_;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      this->optimize_for_ = from->optimize_for_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      java_multiple_files_ = from.java_multiple_files_;
    }
    if (cached_has_bits & 0x00000800u) {
      java_generate_equals_and_hash_ = from.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00001000u) {
      java_string_check_utf8_ = from.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00002000u) {
      cc_generic_services_ = from.cc_generic_services_;
    }
    if (cached_has_bits & 0x00004000u) {
      java_generic_services_ = from.java_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      py_generic_services_ = from.py_generic_services_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      php_generic_services_ = from.php_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      cc_enable_arenas_ = from.cc_enable_arenas_;
    }
    if (cached_has_bits & 0x00080000u) {
      optimize_for_ = from.optimize_for_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}